

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O0

uint32_t __thiscall
FastPForLib::PFor::compressblockPFOR
          (PFor *this,DATATYPE *in,uint32_t *outputbegin,uint32_t b,DATATYPE **exceptions)

{
  uint uVar1;
  uint uVar2;
  value_type *pvVar3;
  uint uVar4;
  value_type vVar5;
  reference pvVar6;
  int in_ECX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  uint32_t *in_RDI;
  undefined8 *in_R8;
  uint32_t cur_1;
  uint32_t i_1;
  uint32_t compulcur;
  uint32_t cur;
  uint32_t i;
  uint32_t prev;
  uint32_t firstexcept;
  uint32_t k_1;
  iterator cci;
  uint32_t maxgap;
  size_t exceptcounter;
  size_t k;
  undefined4 in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7c;
  value_type in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_60;
  uint local_5c;
  uint local_54;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  uint local_44;
  size_type local_40;
  ulong local_38;
  undefined8 *local_30;
  undefined4 *local_20;
  undefined4 *local_18;
  uint local_4;
  
  if (in_ECX == 0x20) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_38 = 0; local_38 < 0x80; local_38 = local_38 + 1) {
      *local_20 = *local_18;
      local_20 = local_20 + 1;
      local_18 = local_18 + 1;
    }
    local_4 = 0x80;
  }
  else {
    local_40 = 0;
    local_44 = 1 << ((byte)in_ECX & 0x1f);
    local_30 = in_R8;
    local_18 = in_RSI;
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_54 = 0;
    while (local_54 < 0x80) {
      in_stack_ffffffffffffff84 = local_54;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                          local_40);
      *pvVar6 = in_stack_ffffffffffffff84;
      local_40 = (local_44 <= (uint)local_18[local_54]) + local_40;
      local_54 = local_54 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_50);
    }
    if (local_40 == 0) {
      packblock((PFor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
      local_4 = 0x80;
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::assign<unsigned_int_const*,void>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                 (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),0);
      uVar1 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                          (ulong)uVar1);
      vVar5 = *pvVar6;
      pvVar3 = (value_type *)*local_30;
      *local_30 = pvVar3 + 1;
      *pvVar3 = vVar5;
      local_5c = uVar1;
      if (local_44 < 0x80) {
        for (local_60 = 1; local_60 < local_40; local_60 = local_60 + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                              (ulong)local_60);
          uVar2 = *pvVar6;
          while (local_44 + local_5c < uVar2) {
            uVar4 = local_5c + local_44;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                                (ulong)uVar4);
            vVar5 = *pvVar6;
            pvVar3 = (value_type *)*local_30;
            *local_30 = pvVar3 + 1;
            *pvVar3 = vVar5;
            in_stack_ffffffffffffff80 = local_44 - 1;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                                (ulong)local_5c);
            *pvVar6 = in_stack_ffffffffffffff80;
            local_5c = uVar4;
          }
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)uVar2);
          vVar5 = *pvVar6;
          pvVar3 = (value_type *)*local_30;
          *local_30 = pvVar3 + 1;
          *pvVar3 = vVar5;
          in_stack_ffffffffffffff7c = (uVar2 - local_5c) - 1;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)local_5c);
          *pvVar6 = in_stack_ffffffffffffff7c;
          local_5c = uVar2;
        }
      }
      else {
        for (in_stack_ffffffffffffff94 = 1; in_stack_ffffffffffffff94 < local_40;
            in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                              (ulong)in_stack_ffffffffffffff94);
          in_stack_ffffffffffffff90 = *pvVar6;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)in_stack_ffffffffffffff90);
          vVar5 = *pvVar6;
          pvVar3 = (value_type *)*local_30;
          *local_30 = pvVar3 + 1;
          *pvVar3 = vVar5;
          vVar5 = (in_stack_ffffffffffffff90 - local_5c) - 1;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                              (ulong)local_5c);
          *pvVar6 = vVar5;
          local_5c = in_stack_ffffffffffffff90;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),0);
      packblock((PFor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI,
                (uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
      local_4 = uVar1;
    }
  }
  return local_4;
}

Assistant:

uint32_t compressblockPFOR(const DATATYPE *__restrict__ in,
                             uint32_t *__restrict__ outputbegin,
                             const uint32_t b,
                             DATATYPE *__restrict__ &exceptions) {
    if (b == 32) {
      for (size_t k = 0; k < BlockSize; ++k)
        *(outputbegin++) = *(in++);
      return BlockSize;
    }
    size_t exceptcounter = 0;
    const uint32_t maxgap = 1U << b;
    {
      std::vector<uint32_t>::iterator cci = codedcopy.begin();
      for (uint32_t k = 0; k < BlockSize; ++k, ++cci) {
        miss[exceptcounter] = k;
        exceptcounter += (in[k] >= maxgap);
      }
    }
    if (exceptcounter == 0) {
      packblock(in, outputbegin, b);
      return BlockSize;
    }
    codedcopy.assign(in, in + BlockSize);
    uint32_t firstexcept = miss[0];
    uint32_t prev = 0;
    *(exceptions++) = codedcopy[firstexcept];
    prev = firstexcept;
    if (maxgap < BlockSize) {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        // they don't include this part, but it is required:
        while (cur > maxgap + prev) {
          // compulsory exception
          uint32_t compulcur = prev + maxgap;
          *(exceptions++) = codedcopy[compulcur];
          codedcopy[prev] = maxgap - 1;
          prev = compulcur;
        }
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    } else {
      for (uint32_t i = 1; i < exceptcounter; ++i) {
        uint32_t cur = miss[i];
        *(exceptions++) = codedcopy[cur];
        codedcopy[prev] = cur - prev - 1;
        prev = cur;
      }
    }
    packblock(&codedcopy[0], outputbegin, b);
    return firstexcept;
  }